

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *
__thiscall cmComputeLinkDepends::Compute(cmComputeLinkDepends *this)

{
  BFSEntry qe_00;
  FILE *__stream;
  __normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
  __first;
  bool bVar1;
  TargetType TVar2;
  reference pvVar3;
  reference dep;
  undefined8 uVar4;
  pointer this_00;
  iterator iVar5;
  iterator __last;
  reference ppVar6;
  pointer pLVar7;
  reference piVar8;
  reference pvVar9;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar10;
  byte local_1e9;
  char *local_1d0;
  const_iterator local_1b0;
  LinkEntry *local_1a8;
  const_iterator local_1a0;
  LinkEntry *local_198;
  undefined1 local_190 [16];
  const_reverse_iterator i_2;
  __normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
  local_158;
  iterator it;
  LinkEntry *groupEntry;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> *group;
  iterator __end2;
  iterator __begin2;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range2;
  undefined1 local_110 [4];
  int i_1;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  __end1_1;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  __begin1_1;
  cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range1_1;
  bool uniquify;
  cmGeneratorTarget *t;
  LinkEntry *e;
  undefined1 local_a8 [4];
  int i;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  __end1;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  __begin1;
  vector<int,_std::allocator<int>_> local_88;
  cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> emitted;
  BFSEntry qe;
  cmComputeLinkDepends *this_local;
  
  AddDirectLinkEntries(this);
  while (bVar1 = std::
                 queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
                 ::empty(&this->BFSQueue), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar3 = std::
             queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
             ::front(&this->BFSQueue);
    qe_00.Index = pvVar3->Index;
    qe_00.GroupIndex = pvVar3->GroupIndex;
    qe_00.LibDepends = pvVar3->LibDepends;
    std::
    queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
    ::pop(&this->BFSQueue);
    FollowLinkEntry(this,qe_00);
  }
  while (bVar1 = std::
                 queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
                 ::empty(&this->SharedDepQueue), ((bVar1 ^ 0xffU) & 1) != 0) {
    dep = std::
          queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
          ::front(&this->SharedDepQueue);
    HandleSharedDependency(this,dep);
    std::
    queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
    ::pop(&this->SharedDepQueue);
  }
  InferDependencies(this);
  UpdateGroupDependencies(this);
  CleanConstraintGraph(this);
  if ((this->DebugMode & 1U) != 0) {
    fprintf(_stderr,
            "------------------------------------------------------------------------------\n");
    __stream = _stderr;
    cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    uVar4 = std::__cxx11::string::c_str();
    if ((this->HasConfig & 1U) == 0) {
      local_1d0 = "noconfig";
    }
    else {
      local_1d0 = (char *)std::__cxx11::string::c_str();
    }
    fprintf(__stream,"Link dependency analysis for target %s, config %s\n",uVar4,local_1d0);
    DisplayConstraintGraph(this);
  }
  std::make_unique<cmComputeComponentGraph,cmGraphAdjacencyList&>
            ((cmGraphAdjacencyList *)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::operator=
            (&this->CCG,
             (unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
             &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  ~unique_ptr((unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
              &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  this_00 = std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
            ::operator->(&this->CCG);
  cmComputeComponentGraph::Compute(this_00);
  bVar1 = CheckCircularDependencies(this);
  if (bVar1) {
    OrderLinkEntries(this);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
    cmReverseRange<std::vector<int,_std::allocator<int>_>_>(&local_88);
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&local_88;
    cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::begin((cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
             *)&__end1);
    cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::end((cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
           *)local_a8);
    while (bVar1 = std::operator!=(&__end1,(reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                            *)local_a8), bVar1) {
      piVar8 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator*(&__end1);
      e._4_4_ = *piVar8;
      pvVar9 = std::
               vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ::operator[](&this->EntryList,(long)e._4_4_);
      bVar1 = false;
      if (pvVar9->Target != (cmGeneratorTarget *)0x0) {
        TVar2 = cmGeneratorTarget::GetType(pvVar9->Target);
        bVar1 = TVar2 == SHARED_LIBRARY;
      }
      local_1e9 = 1;
      if (bVar1) {
        pVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,
                            (value_type_conflict1 *)((long)&e + 4));
        local_1e9 = pVar10.second;
      }
      if ((local_1e9 & 1) != 0) {
        std::
        vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
        push_back(&this->FinalLinkEntries,pvVar9);
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
      ::operator++(&__end1);
    }
    cmReverseRange<std::vector<int,_std::allocator<int>_>_>
              ((vector<int,_std::allocator<int>_> *)&__begin1_1);
    cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::begin((cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
             *)&__end1_1);
    cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::end((cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
           *)local_110);
    while (bVar1 = std::operator!=(&__end1_1,
                                   (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                    *)local_110), bVar1) {
      piVar8 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator*(&__end1_1);
      pvVar9 = std::
               vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ::operator[](&this->EntryList,(long)*piVar8);
      std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>::
      emplace_back<cmComputeLinkDepends::LinkEntry&>
                ((vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>
                  *)&this->FinalLinkEntries,pvVar9);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
      ::operator++(&__end1_1);
    }
    iVar5 = std::
            vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
            ::begin(&this->FinalLinkEntries);
    __last = std::
             vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ::end(&this->FinalLinkEntries);
    std::
    reverse<__gnu_cxx::__normal_iterator<cmComputeLinkDepends::LinkEntry*,std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>>>
              ((__normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                )iVar5._M_current,
               (__normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                )__last._M_current);
    bVar1 = std::
            map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::empty(&this->GroupItems);
    if (!bVar1) {
      __end2 = std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::begin(&this->GroupItems);
      group = (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)
              std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::end(&this->GroupItems);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&group), bVar1) {
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
                 operator*(&__end2);
        it._M_current =
             std::
             vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ::operator[](&this->EntryList,(long)ppVar6->first);
        local_158._M_current =
             (LinkEntry *)
             std::
             vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ::begin(&this->FinalLinkEntries);
        while( true ) {
          __first._M_current = local_158._M_current;
          iVar5 = std::
                  vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                  ::end(&this->FinalLinkEntries);
          local_158 = std::
                      find_if<__gnu_cxx::__normal_iterator<cmComputeLinkDepends::LinkEntry*,std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>>,cmComputeLinkDepends::Compute()::__0>
                                (__first,iVar5._M_current,it._M_current);
          i_2.current._M_current =
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               std::
               vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ::end(&this->FinalLinkEntries);
          bVar1 = __gnu_cxx::operator==
                            (&local_158,
                             (__normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                              *)&i_2);
          if (bVar1) break;
          pLVar7 = __gnu_cxx::
                   __normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                   ::operator->(&local_158);
          std::__cxx11::string::operator=((string *)pLVar7,"</LINK_GROUP>");
          std::vector<int,_std::allocator<int>_>::rbegin
                    ((vector<int,_std::allocator<int>_> *)(local_190 + 8));
          while( true ) {
            std::vector<int,_std::allocator<int>_>::rend
                      ((vector<int,_std::allocator<int>_> *)local_190);
            bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                     *)(local_190 + 8),
                                    (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                     *)local_190);
            if (!bVar1) break;
            __gnu_cxx::
            __normal_iterator<cmComputeLinkDepends::LinkEntry_const*,std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>>
            ::__normal_iterator<cmComputeLinkDepends::LinkEntry*>
                      ((__normal_iterator<cmComputeLinkDepends::LinkEntry_const*,std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>>
                        *)&local_1a0,&local_158);
            piVar8 = std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                     ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                  *)(local_190 + 8));
            pvVar9 = std::
                     vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                     ::operator[](&this->EntryList,(long)*piVar8);
            local_198 = (LinkEntry *)
                        std::
                        vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                        ::insert(&this->FinalLinkEntries,local_1a0,pvVar9);
            local_158._M_current = local_198;
            std::
            reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
            ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                          *)(local_190 + 8));
          }
          __gnu_cxx::
          __normal_iterator<cmComputeLinkDepends::LinkEntry_const*,std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>>
          ::__normal_iterator<cmComputeLinkDepends::LinkEntry*>
                    ((__normal_iterator<cmComputeLinkDepends::LinkEntry_const*,std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>>
                      *)&local_1b0,&local_158);
          local_1a8 = (LinkEntry *)
                      std::
                      vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      ::insert(&this->FinalLinkEntries,local_1b0,it._M_current);
          local_158._M_current = local_1a8;
          pLVar7 = __gnu_cxx::
                   __normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                   ::operator->(&local_158);
          std::__cxx11::string::operator=((string *)pLVar7,"<LINK_GROUP>");
        }
        std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
        operator++(&__end2);
      }
    }
    if ((this->DebugMode & 1U) != 0) {
      DisplayFinalEntries(this);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  }
  this_local = (cmComputeLinkDepends *)&this->FinalLinkEntries;
  return (vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
          *)this_local;
}

Assistant:

std::vector<cmComputeLinkDepends::LinkEntry> const&
cmComputeLinkDepends::Compute()
{
  // Follow the link dependencies of the target to be linked.
  this->AddDirectLinkEntries();

  // Complete the breadth-first search of dependencies.
  while (!this->BFSQueue.empty()) {
    // Get the next entry.
    BFSEntry qe = this->BFSQueue.front();
    this->BFSQueue.pop();

    // Follow the entry's dependencies.
    this->FollowLinkEntry(qe);
  }

  // Complete the search of shared library dependencies.
  while (!this->SharedDepQueue.empty()) {
    // Handle the next entry.
    this->HandleSharedDependency(this->SharedDepQueue.front());
    this->SharedDepQueue.pop();
  }

  // Infer dependencies of targets for which they were not known.
  this->InferDependencies();

  // finalize groups dependencies
  // All dependencies which are raw items must be replaced by the group
  // it belongs to, if any.
  this->UpdateGroupDependencies();

  // Cleanup the constraint graph.
  this->CleanConstraintGraph();

  // Display the constraint graph.
  if (this->DebugMode) {
    fprintf(stderr,
            "---------------------------------------"
            "---------------------------------------\n");
    fprintf(stderr, "Link dependency analysis for target %s, config %s\n",
            this->Target->GetName().c_str(),
            this->HasConfig ? this->Config.c_str() : "noconfig");
    this->DisplayConstraintGraph();
  }

  // Compute the DAG of strongly connected components.  The algorithm
  // used by cmComputeComponentGraph should identify the components in
  // the same order in which the items were originally discovered in
  // the BFS.  This should preserve the original order when no
  // constraints disallow it.
  this->CCG =
    cm::make_unique<cmComputeComponentGraph>(this->EntryConstraintGraph);
  this->CCG->Compute();

  if (!this->CheckCircularDependencies()) {
    return this->FinalLinkEntries;
  }

  // Compute the final ordering.
  this->OrderLinkEntries();

  // Compute the final set of link entries.
  // Iterate in reverse order so we can keep only the last occurrence
  // of a shared library.
  std::set<int> emitted;
  for (int i : cmReverseRange(this->FinalLinkOrder)) {
    LinkEntry const& e = this->EntryList[i];
    cmGeneratorTarget const* t = e.Target;
    // Entries that we know the linker will re-use do not need to be repeated.
    bool uniquify = t && t->GetType() == cmStateEnums::SHARED_LIBRARY;
    if (!uniquify || emitted.insert(i).second) {
      this->FinalLinkEntries.push_back(e);
    }
  }
  // Place explicitly linked object files in the front.  The linker will
  // always use them anyway, and they may depend on symbols from libraries.
  // Append in reverse order since we reverse the final order below.
  for (int i : cmReverseRange(this->ObjectEntries)) {
    this->FinalLinkEntries.emplace_back(this->EntryList[i]);
  }
  // Reverse the resulting order since we iterated in reverse.
  std::reverse(this->FinalLinkEntries.begin(), this->FinalLinkEntries.end());

  // Expand group items
  if (!this->GroupItems.empty()) {
    for (const auto& group : this->GroupItems) {
      const LinkEntry& groupEntry = this->EntryList[group.first];
      auto it = this->FinalLinkEntries.begin();
      while (true) {
        it = std::find_if(it, this->FinalLinkEntries.end(),
                          [&groupEntry](const LinkEntry& entry) -> bool {
                            return groupEntry.Item == entry.Item;
                          });
        if (it == this->FinalLinkEntries.end()) {
          break;
        }
        it->Item.Value = "</LINK_GROUP>";
        for (auto i = group.second.rbegin(); i != group.second.rend(); ++i) {
          it = this->FinalLinkEntries.insert(it, this->EntryList[*i]);
        }
        it = this->FinalLinkEntries.insert(it, groupEntry);
        it->Item.Value = "<LINK_GROUP>";
      }
    }
  }

  // Display the final set.
  if (this->DebugMode) {
    this->DisplayFinalEntries();
  }

  return this->FinalLinkEntries;
}